

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::TransitionResourceStates
          (DeviceContextVkImpl *this,Uint32 BarrierCount,StateTransitionDesc *pResourceBarriers)

{
  IDeviceObject *pIVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ulong uVar6;
  string msg;
  RefCntAutoPtr<Diligent::BottomLevelASVkImpl> pBottomLevelAS;
  RefCntAutoPtr<Diligent::TopLevelASVkImpl> pTopLevelAS;
  RefCntAutoPtr<Diligent::BufferVkImpl> pBuffer;
  RefCntAutoPtr<Diligent::TextureVkImpl> pTexture;
  string local_70;
  RefCntAutoPtr<Diligent::BottomLevelASVkImpl> local_50;
  RefCntAutoPtr<Diligent::TopLevelASVkImpl> local_48;
  RefCntAutoPtr<Diligent::BufferVkImpl> local_40;
  RefCntAutoPtr<Diligent::TextureVkImpl> local_38;
  
  uVar6 = (ulong)BarrierCount;
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
      (RenderPassVkImpl *)0x0) {
    FormatString<char[55]>
              (&local_70,(char (*) [55])"State transitions are not allowed inside a render pass");
    DebugAssertionFailed
              ((Char *)CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_),
               "TransitionResourceStates",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xd22);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_) !=
        &local_70.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_),
                      CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                               local_70.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  if (BarrierCount != 0) {
    EnsureVkCmdBuffer(this);
    do {
      DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifyStateTransitionDesc
                ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pResourceBarriers);
      if (pResourceBarriers->TransitionType == STATE_TRANSITION_TYPE_BEGIN) {
        if ((pResourceBarriers->Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) !=
            STATE_TRANSITION_FLAG_NONE) {
          FormatString<char[55]>
                    (&local_70,
                     (char (*) [55])"Resource state can\'t be updated in begin-split barrier");
          DebugAssertionFailed
                    ((Char *)CONCAT44(local_70._M_dataplus._M_p._4_4_,
                                      local_70._M_dataplus._M_p._0_4_),"TransitionResourceStates",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0xd32);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_) !=
              &local_70.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_
                                    ),
                            CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                                     local_70.field_2._M_allocated_capacity._0_4_) + 1);
          }
        }
      }
      else if ((pResourceBarriers->Flags & STATE_TRANSITION_FLAG_ALIASING) ==
               STATE_TRANSITION_FLAG_NONE) {
        if ((pResourceBarriers->TransitionType & ~STATE_TRANSITION_TYPE_END) !=
            STATE_TRANSITION_TYPE_IMMEDIATE) {
          FormatString<char[24]>(&local_70,(char (*) [24])"Unexpected barrier type");
          DebugAssertionFailed
                    ((Char *)CONCAT44(local_70._M_dataplus._M_p._4_4_,
                                      local_70._M_dataplus._M_p._0_4_),"TransitionResourceStates",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0xd3b);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_) !=
              &local_70.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_
                                    ),
                            CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                                     local_70.field_2._M_allocated_capacity._0_4_) + 1);
          }
        }
        pIVar1 = pResourceBarriers->pResource;
        local_38.m_pObject = (TextureVkImpl *)0x0;
        if (pIVar1 == (IDeviceObject *)0x0) {
          local_40.m_pObject = (BufferVkImpl *)0x0;
LAB_0028fe10:
          local_50.m_pObject = (BottomLevelASVkImpl *)0x0;
          local_48.m_pObject = (TopLevelASVkImpl *)0x0;
LAB_0028fe19:
          FormatString<char[26]>(&local_70,(char (*) [26])"unsupported resource type");
          DebugAssertionFailed
                    ((Char *)CONCAT44(local_70._M_dataplus._M_p._4_4_,
                                      local_70._M_dataplus._M_p._0_4_),"TransitionResourceStates",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0xd55);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_) !=
              &local_70.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_
                                    ),
                            CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                                     local_70.field_2._M_allocated_capacity._0_4_) + 1);
          }
LAB_0028fe59:
          RefCntAutoPtr<Diligent::TopLevelASVkImpl>::Release(&local_48);
LAB_0028fe63:
          RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::Release(&local_50);
LAB_0028fe6d:
          RefCntAutoPtr<Diligent::BufferVkImpl>::Release(&local_40);
        }
        else {
          (**(pIVar1->super_IObject)._vptr_IObject)(pIVar1,IID_TextureVk,&local_38);
          if (local_38.m_pObject == (TextureVkImpl *)0x0) {
            pIVar1 = pResourceBarriers->pResource;
            local_40.m_pObject = (BufferVkImpl *)0x0;
            if (pIVar1 == (IDeviceObject *)0x0) goto LAB_0028fe10;
            (**(pIVar1->super_IObject)._vptr_IObject)(pIVar1,IID_BufferVk,&local_40);
            if (local_40.m_pObject == (BufferVkImpl *)0x0) {
              pIVar1 = pResourceBarriers->pResource;
              local_50.m_pObject = (BottomLevelASVkImpl *)0x0;
              if (pIVar1 == (IDeviceObject *)0x0) goto LAB_0028fe10;
              (**(pIVar1->super_IObject)._vptr_IObject)(pIVar1,IID_BottomLevelAS,&local_50);
              if (local_50.m_pObject == (BottomLevelASVkImpl *)0x0) {
                pIVar1 = pResourceBarriers->pResource;
                local_48.m_pObject = (TopLevelASVkImpl *)0x0;
                if ((pIVar1 == (IDeviceObject *)0x0) ||
                   ((**(pIVar1->super_IObject)._vptr_IObject)(pIVar1,IID_TopLevelAS,&local_48),
                   local_48.m_pObject == (TopLevelASVkImpl *)0x0)) goto LAB_0028fe19;
                TransitionTLASState(this,local_48.m_pObject,pResourceBarriers->OldState,
                                    pResourceBarriers->NewState,
                                    (bool)(pResourceBarriers->Flags &
                                          STATE_TRANSITION_FLAG_UPDATE_STATE));
                goto LAB_0028fe59;
              }
              TransitionBLASState(this,local_50.m_pObject,pResourceBarriers->OldState,
                                  pResourceBarriers->NewState,
                                  (bool)(pResourceBarriers->Flags &
                                        STATE_TRANSITION_FLAG_UPDATE_STATE));
              goto LAB_0028fe63;
            }
            TransitionBufferState
                      (this,local_40.m_pObject,pResourceBarriers->OldState,
                       pResourceBarriers->NewState,
                       (bool)(pResourceBarriers->Flags & STATE_TRANSITION_FLAG_UPDATE_STATE));
            goto LAB_0028fe6d;
          }
          local_70._M_dataplus._M_p._0_4_ = 0;
          uVar2 = pResourceBarriers->FirstMipLevel;
          uVar3 = pResourceBarriers->MipLevelsCount;
          uVar4 = pResourceBarriers->FirstArraySlice;
          uVar5 = pResourceBarriers->ArraySliceCount;
          local_70._M_dataplus._M_p._4_4_ = uVar2;
          local_70._M_string_length._0_4_ = uVar3;
          local_70._M_string_length._4_4_ = uVar4;
          local_70.field_2._M_allocated_capacity._0_4_ = uVar5;
          TransitionTextureState
                    (this,local_38.m_pObject,pResourceBarriers->OldState,pResourceBarriers->NewState
                     ,pResourceBarriers->Flags,(VkImageSubresourceRange *)&local_70);
        }
        RefCntAutoPtr<Diligent::TextureVkImpl>::Release(&local_38);
      }
      else {
        AliasingBarrier(this,pResourceBarriers->pResourceBefore,pResourceBarriers->pResource);
      }
      pResourceBarriers = pResourceBarriers + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionResourceStates(Uint32 BarrierCount, const StateTransitionDesc* pResourceBarriers)
{
    VERIFY(m_pActiveRenderPass == nullptr, "State transitions are not allowed inside a render pass");

    if (BarrierCount == 0)
        return;

    EnsureVkCmdBuffer();

    for (Uint32 i = 0; i < BarrierCount; ++i)
    {
        const StateTransitionDesc& Barrier = pResourceBarriers[i];
#ifdef DILIGENT_DEVELOPMENT
        DvpVerifyStateTransitionDesc(Barrier);
#endif
        if (Barrier.TransitionType == STATE_TRANSITION_TYPE_BEGIN)
        {
            // Skip begin-split barriers
            VERIFY((Barrier.Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) == 0, "Resource state can't be updated in begin-split barrier");
            continue;
        }
        if (Barrier.Flags & STATE_TRANSITION_FLAG_ALIASING)
        {
            AliasingBarrier(Barrier.pResourceBefore, Barrier.pResource);
        }
        else
        {
            VERIFY(Barrier.TransitionType == STATE_TRANSITION_TYPE_IMMEDIATE || Barrier.TransitionType == STATE_TRANSITION_TYPE_END, "Unexpected barrier type");

            if (RefCntAutoPtr<TextureVkImpl> pTexture{Barrier.pResource, IID_TextureVk})
            {
                VkImageSubresourceRange SubResRange;
                SubResRange.aspectMask     = 0;
                SubResRange.baseMipLevel   = Barrier.FirstMipLevel;
                SubResRange.levelCount     = (Barrier.MipLevelsCount == REMAINING_MIP_LEVELS) ? VK_REMAINING_MIP_LEVELS : Barrier.MipLevelsCount;
                SubResRange.baseArrayLayer = Barrier.FirstArraySlice;
                SubResRange.layerCount     = (Barrier.ArraySliceCount == REMAINING_ARRAY_SLICES) ? VK_REMAINING_ARRAY_LAYERS : Barrier.ArraySliceCount;
                TransitionTextureState(*pTexture, Barrier.OldState, Barrier.NewState, Barrier.Flags, &SubResRange);
            }
            else if (RefCntAutoPtr<BufferVkImpl> pBuffer{Barrier.pResource, IID_BufferVk})
            {
                TransitionBufferState(*pBuffer, Barrier.OldState, Barrier.NewState, (Barrier.Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) != 0);
            }
            else if (RefCntAutoPtr<BottomLevelASVkImpl> pBottomLevelAS{Barrier.pResource, IID_BottomLevelAS})
            {
                TransitionBLASState(*pBottomLevelAS, Barrier.OldState, Barrier.NewState, (Barrier.Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) != 0);
            }
            else if (RefCntAutoPtr<TopLevelASVkImpl> pTopLevelAS{Barrier.pResource, IID_TopLevelAS})
            {
                TransitionTLASState(*pTopLevelAS, Barrier.OldState, Barrier.NewState, (Barrier.Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) != 0);
            }
            else
            {
                UNEXPECTED("unsupported resource type");
            }
        }
    }
}